

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> * __thiscall
LZ77Compressor::compress(LZ77Compressor *this,uint8_t *input,int inputLength)

{
  int end;
  int i;
  int local_34;
  value_type local_30;
  
  clear(this);
  local_34 = 0;
  end = inputLength + -2;
  while (local_34 < inputLength - this->maxMatch) {
    next(this,input,&local_34,this->maxMatch,end);
  }
  while (local_34 < end) {
    next(this,input,&local_34,inputLength - local_34,end);
  }
  for (; local_34 < inputLength; local_34 = local_34 + 1) {
    local_30.field_1.field_1.offset = 0;
    local_30._0_4_ = (uint)input[local_34] << 0x10;
    std::vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>::push_back
              (&this->output,&local_30);
  }
  return &this->output;
}

Assistant:

const std::vector<Item>& compress(const uint8_t* input, int inputLength) {
		clear();
		int i = 0;
		int matchOff, matchLen;
		while (i < inputLength - maxMatch) {
			next(input, i, maxMatch, inputLength - 2);
		}
		while (i < inputLength - 2) {
			next(input, i, inputLength - i, inputLength - 2);
		}
		for (; i < inputLength; i++) {
			Item item = {0};
			item.isRepeat = false;
			item.value = input[i];
			output.push_back(item);
		}
		return output;
	}